

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O2

void OpenMD::LUSolveLinearSystem<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,int *index,ElemPoinerType x,int size)

{
  ulong uVar1;
  long lVar2;
  ElemPoinerType pdVar3;
  ulong uVar4;
  ulong uVar5;
  double (*padVar6) [6];
  long lVar7;
  double dVar8;
  
  uVar1 = 0;
  uVar4 = 0;
  if (0 < size) {
    uVar4 = (ulong)(uint)size;
  }
  uVar5 = 0xffffffff;
  padVar6 = (double (*) [6])A;
  for (; uVar1 != uVar4; uVar1 = uVar1 + 1) {
    dVar8 = x[index[uVar1]];
    x[index[uVar1]] = x[uVar1];
    if ((int)uVar5 < 0) {
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        uVar5 = uVar1 & 0xffffffff;
      }
    }
    else {
      lVar2 = uVar5 << 3;
      for (lVar7 = uVar5 << 0x20; lVar7 >> 0x20 < (long)uVar1; lVar7 = lVar7 + 0x100000000) {
        dVar8 = dVar8 - *(double *)
                         ((long)((RectMatrix<double,_6U,_6U> *)*padVar6)->data_[0] + lVar2) *
                        *(double *)((long)x + lVar2);
        lVar2 = lVar2 + 8;
      }
    }
    x[uVar1] = dVar8;
    padVar6 = padVar6 + 1;
  }
  uVar1 = (ulong)(uint)size;
  lVar2 = (long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar1 * 0x38 + -0x30;
  pdVar3 = x + uVar1;
  while (0 < (int)uVar1) {
    uVar4 = uVar1 - 1;
    dVar8 = x[uVar4];
    for (lVar7 = 0; (int)uVar1 + (int)lVar7 < size; lVar7 = lVar7 + 1) {
      dVar8 = dVar8 - *(double *)(lVar2 + lVar7 * 8) * pdVar3[lVar7];
    }
    x[uVar4] = dVar8 / *(double *)
                        ((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar1 * 0x38 + -0x38);
    lVar2 = lVar2 + -0x38;
    pdVar3 = pdVar3 + -1;
    uVar1 = uVar4;
  }
  return;
}

Assistant:

void LUSolveLinearSystem(MatrixType& A, int* index,
                           typename MatrixType::ElemPoinerType x, int size) {
    using Real = typename MatrixType::ElemType;

    int i, j, ii, idx;
    Real sum;
    //
    // Proceed with forward and backsubstitution for L and U
    // matrices.  First, forward substitution.
    //
    for (ii = -1, i = 0; i < size; ++i) {
      idx    = index[i];
      sum    = x[idx];
      x[idx] = x[i];

      if (ii >= 0) {
        for (j = ii; j <= (i - 1); ++j) {
          sum -= A(i, j) * x[j];
        }
      } else if (sum != 0.0) {
        ii = i;
      }

      x[i] = sum;
    }
    //
    // Now, back substitution
    //
    for (i = size - 1; i >= 0; i--) {
      sum = x[i];
      for (j = i + 1; j < size; ++j) {
        sum -= A(i, j) * x[j];
      }
      x[i] = sum / A(i, i);
    }
  }